

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::locate_soi_marker(jpeg_decoder *this)

{
  uint uVar1;
  jpeg_decoder *in_RDI;
  bool bVar2;
  uint bytesleft;
  uint thischar;
  uint lastchar;
  jpgd_status in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar3;
  uint local_10;
  
  uVar1 = get_bits((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                   (int)((ulong)in_RDI >> 0x20));
  local_10 = get_bits((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (int)((ulong)in_RDI >> 0x20));
  if ((uVar1 != 0xff) || (local_10 != 0xd8)) {
    iVar3 = 0x1000;
    while( true ) {
      do {
        iVar3 = iVar3 + -1;
        if (iVar3 == 0) {
          stop_decoding(in_RDI,in_stack_ffffffffffffffdc);
        }
        uVar1 = get_bits((jpeg_decoder *)CONCAT44(iVar3,in_stack_ffffffffffffffe8),
                         (int)((ulong)in_RDI >> 0x20));
        bVar2 = local_10 != 0xff;
        local_10 = uVar1;
      } while (bVar2);
      if (uVar1 == 0xd8) break;
      if (uVar1 == 0xd9) {
        stop_decoding(in_RDI,in_stack_ffffffffffffffdc);
      }
    }
    if (in_RDI->m_bit_buf >> 0x18 != 0xff) {
      stop_decoding(in_RDI,in_stack_ffffffffffffffdc);
    }
  }
  return;
}

Assistant:

void jpeg_decoder::locate_soi_marker() {
  uint lastchar, thischar;
  uint bytesleft;

  lastchar = get_bits(8);

  thischar = get_bits(8);

  /* ok if it's a normal JPEG file without a special header */

  if ((lastchar == 0xFF) && (thischar == M_SOI))
    return;

  bytesleft = 4096;  //512;

  for (;;) {
    if (--bytesleft == 0)
      stop_decoding(JPGD_NOT_JPEG);

    lastchar = thischar;

    thischar = get_bits(8);

    if (lastchar == 0xFF) {
      if (thischar == M_SOI)
        break;
      else if (thischar == M_EOI)  // get_bits will keep returning M_EOI if we read past the end
        stop_decoding(JPGD_NOT_JPEG);
    }
  }

  // Check the next character after marker: if it's not 0xFF, it can't be the start of the next marker, so the file is bad.
  thischar = (m_bit_buf >> 24) & 0xFF;

  if (thischar != 0xFF)
    stop_decoding(JPGD_NOT_JPEG);
}